

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptbuilder.cpp
# Opt level: O1

void __thiscall
ScriptBuilder_ScriptStackByOperator_Test::~ScriptBuilder_ScriptStackByOperator_Test
          (ScriptBuilder_ScriptStackByOperator_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ScriptBuilder, ScriptStackByOperator) {
  std::string exp_hex = "4c6a47304402205a2f94921f645669b2b4e073da43e6a5d32335b50207f9d27f0e8a8c0a24e75902205dea52d27ad747f2df786e0ad737595cf9c5a489143170668399764a5b4be44a01210229e026bab56c1c41d16e67f084362aef204b5b7ea08dafc2fb2e0db89d9c9551";

  ScriptBuilder build1;
  build1 << ByteData("304402205a2f94921f645669b2b4e073da43e6a5d32335b50207f9d27f0e8a8c0a24e75902205dea52d27ad747f2df786e0ad737595cf9c5a489143170668399764a5b4be44a01");
  build1 << Pubkey("0229e026bab56c1c41d16e67f084362aef204b5b7ea08dafc2fb2e0db89d9c9551");
  auto script1 = build1.Build();

  ScriptBuilder builder;
  builder << script1;
  auto script = builder.Build();
  EXPECT_EQ(exp_hex, script.GetHex());
}